

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O3

void VerifyTargetChain(AActor *self,bool preciseMissileCheck)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  undefined4 extraout_var_00;
  AActor *pAVar5;
  AActor *pAVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar7;
  AActor *pAVar8;
  PClass *pPVar3;
  
  if (self != (AActor *)0x0) {
    uVar1 = (self->flags).Value;
    if ((uVar1 & 0x10000) != 0 || !preciseMissileCheck) {
      if ((uVar1 >> 0x10 & 1) == 0) {
        return;
      }
    }
    else {
      pPVar3 = (self->super_DThinker).super_DObject.Class;
      if (pPVar3 == (PClass *)0x0) {
        iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
        (self->super_DThinker).super_DObject.Class = pPVar3;
      }
      if ((pPVar3->Defaults[0x1be] & 1) == 0) {
        return;
      }
    }
    pAVar5 = (self->target).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      paVar7 = &(self->target).field_0;
      pAVar8 = self;
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        do {
          pAVar4 = pAVar5;
          uVar1 = (pAVar4->flags).Value;
          if ((uVar1 & 0x10000) != 0 || !preciseMissileCheck) {
            if ((uVar1 >> 0x10 & 1) == 0) {
              return;
            }
          }
          else {
            pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
            if (pPVar3 == (PClass *)0x0) {
              iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
              pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar2);
              (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
            }
            if ((pPVar3->Defaults[0x1be] & 1) == 0) {
              return;
            }
          }
          pAVar5 = self;
          if (pAVar4 == self) goto LAB_00345e88;
          while (pAVar5 != pAVar8) {
            pAVar6 = (pAVar5->target).field_0.p;
            if (pAVar6 == (AActor *)0x0) {
LAB_00345e59:
              pAVar6 = (AActor *)0x0;
            }
            else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
              (pAVar5->target).field_0.p = (AActor *)0x0;
              goto LAB_00345e59;
            }
            pAVar5 = pAVar6;
            if (pAVar6 == pAVar4) goto LAB_00345e88;
          }
          pAVar5 = (pAVar4->target).field_0.p;
          if (pAVar5 == (AActor *)0x0) {
            return;
          }
          pAVar8 = pAVar4;
        } while (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0);
        paVar7 = &(pAVar4->target).field_0;
      }
LAB_00345e88:
      paVar7->p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void VerifyTargetChain(AActor *self, bool preciseMissileCheck)
{
	if (!self || !self->isMissile(preciseMissileCheck)) return;

	AActor *origin = self;
	AActor *next = origin->target;

	// origin: the most recent actor that has been verified as appearing only once
	// next: the next actor to be verified; will be "origin" in the next iteration

	while (next && next->isMissile(preciseMissileCheck)) // we only care when there are missiles involved
	{
		AActor *compare = self;
		// every new actor must prove not to be the first actor in the chain, or any subsequent actor
		// any actor up to and including "origin" has only appeared once
		for (;;)
 		{
			if (compare == next)
			{
				// if any of the actors from self to (inclusive) origin match the next actor,
				// self has reached/created a loop
				self->target = NULL;
				return;
			}
			if (compare == origin) break; // when "compare" = origin, we know that the next actor is, and should be "next"
			compare = compare->target;
		}

		origin = next;
		next = next->target;
	}
}